

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_node.cc
# Opt level: O0

RC __thiscall QL_Node::CheckConditions(QL_Node *this,char *recData)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  void *pvVar4;
  bool comp_5;
  char *shorter_3;
  bool comp_4;
  char *shorter_2;
  bool comp_3;
  bool comp_2;
  char *shorter_1;
  int offset2_2;
  bool comp_1;
  char *shorter;
  int offset2_1;
  bool comp;
  int offset2;
  int offset1;
  int i;
  RC rc;
  char *recData_local;
  QL_Node *this_local;
  
  offset2 = 0;
  do {
    if (this->condIndex <= offset2) {
      return 0;
    }
    iVar1 = this->condList[offset2].offset1;
    if ((this->condList[offset2].isValue & 1U) == 0) {
      if ((this->condList[offset2].type == STRING) &&
         (this->condList[offset2].length != this->condList[offset2].length2)) {
        if (this->condList[offset2].length < this->condList[offset2].length2) {
          iVar2 = this->condList[offset2].offset2;
          pvVar4 = malloc((long)(this->condList[offset2].length + 1));
          memset(pvVar4,0,(long)(this->condList[offset2].length + 1));
          memcpy(pvVar4,recData + iVar1,(long)this->condList[offset2].length);
          *(undefined1 *)((long)pvVar4 + (long)this->condList[offset2].length) = 0;
          bVar3 = (*this->condList[offset2].comparator)
                            (pvVar4,recData + iVar2,this->condList[offset2].type,
                             this->condList[offset2].length + 1);
          free(pvVar4);
          if (!bVar3) {
            return 0x197;
          }
        }
        else {
          iVar2 = this->condList[offset2].offset2;
          pvVar4 = malloc((long)(this->condList[offset2].length2 + 1));
          memset(pvVar4,0,(long)(this->condList[offset2].length2 + 1));
          memcpy(pvVar4,recData + iVar2,(long)this->condList[offset2].length2);
          *(undefined1 *)((long)pvVar4 + (long)this->condList[offset2].length2) = 0;
          bVar3 = (*this->condList[offset2].comparator)
                            (recData + iVar1,pvVar4,this->condList[offset2].type,
                             this->condList[offset2].length2 + 1);
          free(pvVar4);
          if (!bVar3) {
            return 0x197;
          }
        }
      }
      else {
        bVar3 = (*this->condList[offset2].comparator)
                          (recData + iVar1,recData + this->condList[offset2].offset2,
                           this->condList[offset2].type,this->condList[offset2].length);
        if (!bVar3) {
          return 0x197;
        }
      }
    }
    else if ((this->condList[offset2].type == STRING) &&
            (this->condList[offset2].length != this->condList[offset2].length2)) {
      if (this->condList[offset2].length < this->condList[offset2].length2) {
        pvVar4 = malloc((long)(this->condList[offset2].length + 1));
        memset(pvVar4,0,(long)(this->condList[offset2].length + 1));
        memcpy(pvVar4,recData + iVar1,(long)this->condList[offset2].length);
        *(undefined1 *)((long)pvVar4 + (long)this->condList[offset2].length) = 0;
        bVar3 = (*this->condList[offset2].comparator)
                          (pvVar4,this->condList[offset2].data,this->condList[offset2].type,
                           this->condList[offset2].length + 1);
        free(pvVar4);
        if (!bVar3) {
          return 0x197;
        }
      }
      else {
        pvVar4 = malloc((long)(this->condList[offset2].length2 + 1));
        memset(pvVar4,0,(long)(this->condList[offset2].length2 + 1));
        memcpy(pvVar4,this->condList[offset2].data,(long)this->condList[offset2].length2);
        *(undefined1 *)((long)pvVar4 + (long)this->condList[offset2].length2) = 0;
        bVar3 = (*this->condList[offset2].comparator)
                          (recData + iVar1,pvVar4,this->condList[offset2].type,
                           this->condList[offset2].length2 + 1);
        free(pvVar4);
        if (!bVar3) {
          return 0x197;
        }
      }
    }
    else {
      bVar3 = (*this->condList[offset2].comparator)
                        (recData + iVar1,this->condList[offset2].data,this->condList[offset2].type,
                         this->condList[offset2].length);
      if (!bVar3) {
        return 0x197;
      }
    }
    offset2 = offset2 + 1;
  } while( true );
}

Assistant:

RC QL_Node::CheckConditions(char *recData){
  RC rc = 0;
  for(int i = 0; i < condIndex; i++){
    int offset1 = condList[i].offset1;
    // If we are comparing this to a value
    if(! condList[i].isValue){
      // If it's not a string, or string of equal length, just compare
      if(condList[i].type != STRING || condList[i].length == condList[i].length2){
        int offset2 = condList[i].offset2;
        bool comp = condList[i].comparator((void *)(recData + offset1), (void *)(recData + offset2), 
          condList[i].type, condList[i].length);

        if(comp == false){
          return (QL_CONDNOTMET);
        }
      }
      // Depending on if the value or attribute is shorter, null terminate the shorter one and compare
      else if(condList[i].length < condList[i].length2){
        int offset2 = condList[i].offset2;
        char *shorter = (char*)malloc(condList[i].length + 1);
        memset((void *)shorter, 0, condList[i].length + 1);
        memcpy(shorter, recData + offset1, condList[i].length);
        shorter[condList[i].length] = '\0';
        bool comp = condList[i].comparator(shorter, (void*)(recData + offset2), condList[i].type, condList[i].length + 1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
      else{
        int offset2 = condList[i].offset2;
        char *shorter = (char*)malloc(condList[i].length2 + 1);
        memset((void*)shorter, 0, condList[i].length2 + 1);
        memcpy(shorter, recData + offset2, condList[i].length2);
        shorter[condList[i].length2] = '\0';
        bool comp = condList[i].comparator((void*)(recData + offset1), shorter, condList[i].type, condList[i].length2 +1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
    }
    // Else, we are comparing it to another attribute
    else{
      // If it's not a string, or string of equal length, just compare
      if(condList[i].type != STRING || condList[i].length == condList[i].length2){
        bool comp = condList[i].comparator((void *)(recData + offset1), condList[i].data, 
          condList[i].type, condList[i].length);

        if(comp == false)
          return (QL_CONDNOTMET);
      }
      // Depending on which one is shorter, null terminate the shorter one and compare
      else if(condList[i].length < condList[i].length2){
        char *shorter = (char*)malloc(condList[i].length + 1);
        memset((void *)shorter, 0, condList[i].length + 1);
        memcpy(shorter, recData + offset1, condList[i].length);
        shorter[condList[i].length] = '\0';
        bool comp = condList[i].comparator(shorter, condList[i].data, condList[i].type, condList[i].length + 1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
      else{
        char *shorter = (char*)malloc(condList[i].length2 + 1);
        memset((void*)shorter, 0, condList[i].length2 + 1);
        memcpy(shorter, condList[i].data, condList[i].length2);
        shorter[condList[i].length2] = '\0';
        bool comp = condList[i].comparator((void*)(recData + offset1), shorter, condList[i].type, condList[i].length2 +1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
    }
  }

  return (0);
}